

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Logger::notify_status(Logger *this,string *message)

{
  int *piVar1;
  LoggerClient *pLVar2;
  _Base_ptr p_Var3;
  SmartPointer<GEO::LoggerClient> it;
  SmartPointer<GEO::LoggerClient> local_30;
  
  for (p_Var3 = (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_30.pointer_ = *(LoggerClient **)(p_Var3 + 1);
    if (local_30.pointer_ != (LoggerClient *)0x0) {
      piVar1 = &((local_30.pointer_)->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + 1;
    }
    pLVar2 = SmartPointer<GEO::LoggerClient>::operator->(&local_30);
    (*(pLVar2->super_Counted)._vptr_Counted[6])(pLVar2,message);
    SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_30);
  }
  this->current_feature_changed_ = false;
  return;
}

Assistant:

void Logger::notify_status(const std::string& message) {
        for(auto it : clients_) {
            it->status(message);
        }

        current_feature_changed_ = false;
    }